

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O3

bool __thiscall Firework::display(Firework *this,Screen *screen)

{
  if (this->fireworkStage == 2) {
    displayFireworkExplosion(this,screen);
  }
  else {
    if (this->fireworkStage != 1) {
      return false;
    }
    displayStreamer(this,screen);
  }
  return true;
}

Assistant:

bool Firework::display(Screen &screen) {
    if(fireworkStage == UNITIALIZED){
        return false;
    }
    else if(fireworkStage == STREAMER_STAGE) {
        displayStreamer(screen);
        return true;
    }
    else if(fireworkStage == EXPLOSION_STAGE){
        displayFireworkExplosion(screen);
        return true;
    }
    else {
        return false;
    }
}